

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O3

cmGeneratorTarget * __thiscall
cmLocalGenerator::FindGeneratorTargetToUse(cmLocalGenerator *this,string *name)

{
  __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
  __last;
  pointer pcVar1;
  __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
  _Var2;
  cmGeneratorTarget *pcVar3;
  long *local_50 [2];
  long local_40 [2];
  
  _Var2._M_current =
       (this->ImportedGeneratorTargets).
       super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  __last._M_current =
       (this->ImportedGeneratorTargets).
       super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  pcVar1 = (name->_M_dataplus)._M_p;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar1,pcVar1 + name->_M_string_length);
  _Var2 = std::
          find_if<__gnu_cxx::__normal_iterator<cmGeneratorTarget*const*,std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>>,NamedGeneratorTargetFinder>
                    (_Var2,__last,(NamedGeneratorTargetFinder *)local_50);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  if (_Var2._M_current ==
      (this->ImportedGeneratorTargets).
      super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pcVar3 = FindGeneratorTarget(this,name);
    if (pcVar3 == (cmGeneratorTarget *)0x0) {
      pcVar3 = cmGlobalGenerator::FindGeneratorTarget(this->GlobalGenerator,name);
    }
  }
  else {
    pcVar3 = *_Var2._M_current;
  }
  return pcVar3;
}

Assistant:

cmGeneratorTarget*
cmLocalGenerator::FindGeneratorTargetToUse(const std::string& name) const
{
  std::vector<cmGeneratorTarget*>::const_iterator
    imported = std::find_if(this->ImportedGeneratorTargets.begin(),
                            this->ImportedGeneratorTargets.end(),
                            NamedGeneratorTargetFinder(name));
  if(imported != this->ImportedGeneratorTargets.end())
    {
    return *imported;
    }

  if(cmGeneratorTarget* t = this->FindGeneratorTarget(name))
    {
    return t;
    }

  return this->GetGlobalGenerator()->FindGeneratorTarget(name);
}